

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

void __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value_t vVar3;
  pointer pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  integer iVar8;
  
  vVar3 = v->type_;
  this->type_ = vVar3;
  (this->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (v->region_info_).
           super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (v->region_info_).
           super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (v->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (this->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var6;
  (v->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  switch(vVar3) {
  case boolean:
    (this->field_1).boolean_ = (v->field_1).boolean_;
    return;
  case floating:
    (this->field_1).integer_ = (v->field_1).integer_;
    return;
  case string:
    (this->field_1).boolean_ = (v->field_1).boolean_;
    paVar1 = &(this->field_1).string_.str.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&this->field_1 + 8) = paVar1;
    pcVar4 = (v->field_1).string_.str._M_dataplus._M_p;
    paVar2 = &(v->field_1).string_.str.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar2) {
      uVar7 = *(undefined8 *)((long)&(v->field_1).string_.str.field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&(this->field_1).string_.str.field_2 + 8) = uVar7;
    }
    else {
      (this->field_1).string_.str._M_dataplus._M_p = pcVar4;
      (this->field_1).string_.str.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    (this->field_1).string_.str._M_string_length = (v->field_1).string_.str._M_string_length;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&v->field_1 + 8) = paVar2;
    (v->field_1).string_.str._M_string_length = 0;
    *(undefined1 *)((long)&v->field_1 + 0x18) = 0;
    return;
  case offset_datetime:
    pcVar4 = (v->field_1).string_.str._M_dataplus._M_p;
    (this->field_1).integer_ = (v->field_1).integer_;
    (this->field_1).string_.str._M_dataplus._M_p = pcVar4;
    return;
  case local_datetime:
    iVar8 = (v->field_1).integer_;
    *(undefined8 *)
     ((long)&(this->field_1).array_.ptr._M_t.
             super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
     + 6) = *(undefined8 *)
             ((long)&(v->field_1).array_.ptr._M_t.
                     super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
             + 6);
    break;
  case local_date:
    (this->field_1).offset_datetime_.date = (v->field_1).offset_datetime_.date;
    return;
  case local_time:
    (this->field_1).local_time_.nanosecond = (v->field_1).local_time_.nanosecond;
  case integer:
    iVar8 = (v->field_1).integer_;
    break;
  case array:
  case table:
    (this->field_1).integer_ = (v->field_1).integer_;
    (v->field_1).integer_ = 0;
  default:
    return;
  }
  (this->field_1).integer_ = iVar8;
  return;
}

Assistant:

value_t type() const noexcept {return type_;}